

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O2

void bhf::ads::VerifyDataLen(uint32_t type,size_t dataLen,size_t lineNumber)

{
  ostream *poVar1;
  runtime_error *prVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  switch(type) {
  case 0:
    if (dataLen == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      if (lineNumber == 0xffffffffffffffff) {
        poVar1 = std::operator<<(local_190,"Invalid network data: ");
        poVar1 = std::operator<<(poVar1,"data is non-empty but type is REG_N0NE");
      }
      else {
        poVar1 = std::operator<<(local_190,"Invalid file format: ");
        poVar1 = std::operator<<(poVar1,"data is non-empty but type is REG_N0NE");
        poVar1 = std::operator<<(poVar1," in line ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      }
      std::operator<<(poVar1,'\n');
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&local_1e0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    break;
  case 1:
  case 2:
  case 3:
  case 7:
    break;
  case 4:
    if (dataLen != 4) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      if (lineNumber == 0xffffffffffffffff) {
        poVar1 = std::operator<<(local_190,"Invalid network data: ");
        poVar1 = std::operator<<(poVar1,"not enough data bytes for REG_DWORD");
      }
      else {
        poVar1 = std::operator<<(local_190,"Invalid file format: ");
        poVar1 = std::operator<<(poVar1,"not enough data bytes for REG_DWORD");
        poVar1 = std::operator<<(poVar1," in line ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      }
      std::operator<<(poVar1,'\n');
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&local_1e0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    break;
  default:
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    if (lineNumber == 0xffffffffffffffff) {
      poVar1 = std::operator<<(local_190,"Invalid network data: ");
      std::__cxx11::to_string(&local_1c0,type);
      std::operator+(&local_1e0,"unsupported type ",&local_1c0);
      poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
      std::operator<<(poVar1,'\n');
    }
    else {
      poVar1 = std::operator<<(local_190,"Invalid file format: ");
      std::__cxx11::to_string(&local_1c0,type);
      std::operator+(&local_1e0,"unsupported type ",&local_1c0);
      poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
      poVar1 = std::operator<<(poVar1," in line ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,'\n');
    }
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&local_1e0);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0xb:
    if (dataLen != 8) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      if (lineNumber == 0xffffffffffffffff) {
        poVar1 = std::operator<<(local_190,"Invalid network data: ");
        poVar1 = std::operator<<(poVar1,"not enough data bytes for REG_QWORD");
      }
      else {
        poVar1 = std::operator<<(local_190,"Invalid file format: ");
        poVar1 = std::operator<<(poVar1,"not enough data bytes for REG_QWORD");
        poVar1 = std::operator<<(poVar1," in line ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      }
      std::operator<<(poVar1,'\n');
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&local_1e0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

static void VerifyDataLen(const uint32_t type, const size_t dataLen, const size_t lineNumber)
{
    switch (type) {
    case REG_NONE:
        if (!dataLen) {
            PARSING_EXCEPTION("data is non-empty but type is REG_N0NE");
        }
        break;

    case REG_SZ:
    case REG_EXPAND_SZ:
    case REG_BINARY:
    case REG_MULTI_SZ:
        break;

    case REG_DWORD:
        if (sizeof(uint32_t) != dataLen) {
            PARSING_EXCEPTION("not enough data bytes for REG_DWORD");
        }
        break;

    case REG_QWORD:
        if (sizeof(uint64_t) != dataLen) {
            PARSING_EXCEPTION("not enough data bytes for REG_QWORD");
        }
        break;

    default:
        PARSING_EXCEPTION("unsupported type " + std::to_string(type));
    }
}